

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O2

void Mips_printInst(MCInst *MI,SStream *O,void *info)

{
  char *pcVar1;
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar2;
  uint8_t *puVar3;
  char cVar4;
  byte bVar5;
  cs_detail *pcVar6;
  _Bool _Var7;
  uint uVar8;
  mips_reg Op;
  uint uVar9;
  uint RegNo;
  MCOperand *pMVar10;
  MCRegisterClass *pMVar11;
  int64_t iVar12;
  char *s;
  ulong uVar13;
  char *pcVar14;
  SStream *in_R8;
  uint i;
  uint uStack_50;
  
  uVar8 = MCInst_getOpcode(MI);
  if (uVar8 - 0x582 < 2) {
    return;
  }
  if (uVar8 - 0x68b < 2) {
    return;
  }
  uVar8 = MCInst_getOpcode(MI);
  switch(uVar8) {
  case 0xb0:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc0f $\x02";
LAB_00203a2c:
        s = cs_strdup(pcVar14);
        for (pcVar14 = s; cVar4 = *pcVar14, cVar4 != '\0'; pcVar14 = pcVar14 + 1) {
          if ((cVar4 == ' ') || (cVar4 == '\t')) {
            *pcVar14 = '\0';
            pcVar14 = pcVar14 + 1;
            break;
          }
        }
        SStream_concat0(O,s);
        if (*pcVar14 != '\0') {
          SStream_concat0(O,anon_var_dwarf_2d61d8 + 0x11);
          do {
            cVar4 = *pcVar14;
            if (cVar4 == '$') {
              pcVar1 = pcVar14 + 1;
              if (*pcVar1 == -1) {
                pcVar14 = pcVar14 + 3;
              }
              else {
                pcVar14 = pcVar14 + 1;
                printOperand(MI,(int)*pcVar1 - 1,O);
              }
            }
            else {
              if (cVar4 == '\0') break;
              SStream_concat(O,"%c",(ulong)(uint)(int)cVar4);
            }
            pcVar14 = pcVar14 + 1;
          } while( true );
        }
        if (s != (char *)0x0) goto LAB_00203ce1;
      }
    }
    break;
  case 0xb1:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc0fl $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xb2:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc0t $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xb3:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc0tl $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xb4:
  case 0xb7:
  case 0xb8:
  case 0xbb:
  case 0xbc:
  case 0xbf:
    break;
  case 0xb5:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x9b) {
        pcVar14 = "bc1f $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xb6:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x9b) {
        pcVar14 = "bc1fl $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xb9:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x9b) {
        pcVar14 = "bc1t $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xba:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x9b) {
        pcVar14 = "bc1tl $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xbd:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc2f $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xbe:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc2fl $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xc0:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc2t $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xc1:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc2tl $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xc2:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc3f $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xc3:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc3fl $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xc4:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc3t $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  case 0xc5:
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 2) {
      pMVar10 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar10);
      if (uVar8 == 0x1f) {
        pcVar14 = "bc3tl $\x02";
        goto LAB_00203a2c;
      }
    }
    break;
  default:
    if (uVar8 == 0x6e8) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 1) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar10);
        if (_Var7) {
          pMVar10 = MCInst_getOperand(MI,0);
          iVar12 = MCOperand_getImm(pMVar10);
          if (iVar12 == 0) {
            pcVar14 = "wait";
            goto LAB_00203a2c;
          }
        }
      }
    }
    else if (uVar8 == 299) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 2) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar10);
        if (_Var7) {
          pMVar10 = MCInst_getOperand(MI,0);
          iVar12 = MCOperand_getImm(pMVar10);
          if (iVar12 == 0) {
            pMVar10 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isImm(pMVar10);
            if (_Var7) {
              pMVar10 = MCInst_getOperand(MI,1);
              iVar12 = MCOperand_getImm(pMVar10);
              if (iVar12 == 0) {
                pcVar14 = "break";
                goto LAB_00203a2c;
              }
            }
          }
        }
      }
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 2) {
        pMVar10 = MCInst_getOperand(MI,1);
        _Var7 = MCOperand_isImm(pMVar10);
        if (_Var7) {
          pMVar10 = MCInst_getOperand(MI,1);
          iVar12 = MCOperand_getImm(pMVar10);
          if (iVar12 == 0) {
            pcVar14 = "break $\x01";
            goto LAB_00203a2c;
          }
        }
      }
    }
    else if (uVar8 == 0x222) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar10);
        if (_Var7) {
          pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x23);
          pMVar10 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar10);
          _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
          if (_Var7) {
            pMVar10 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar10);
            if (_Var7) {
              pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x23);
              pMVar10 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar10);
              _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
              if (_Var7) {
                pMVar10 = MCInst_getOperand(MI,2);
                uVar8 = MCOperand_getReg(pMVar10);
                if (uVar8 == 0x14b) {
LAB_00203964:
                  pcVar14 = "move $\x01, $\x02";
                  goto LAB_00203a2c;
                }
              }
            }
          }
        }
      }
    }
    else if (uVar8 == 0x233) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 1) {
        pMVar10 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar10);
        if (uVar8 == 0x15) {
          pcVar14 = "di";
          goto LAB_00203a2c;
        }
      }
    }
    else if (uVar8 == 0x28d) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 1) {
        pMVar10 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar10);
        if (uVar8 == 0x15) {
          pcVar14 = "ei";
          goto LAB_00203a2c;
        }
      }
    }
    else if (uVar8 == 0x379) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 2) {
        pMVar10 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar10);
        if (uVar8 == 0x15) {
          pMVar10 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar10);
          if (_Var7) {
            uVar8 = 8;
LAB_0020385e:
            pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,uVar8);
            pMVar10 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar10);
            _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
            if (_Var7) {
              pcVar14 = "jr $\x02";
              goto LAB_00203a2c;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x37b) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 2) {
        pMVar10 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar10);
        if (uVar8 == 0x14b) {
          pMVar10 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar10);
          if (_Var7) {
            uVar8 = 0x23;
            goto LAB_0020385e;
          }
        }
      }
    }
    else if (uVar8 == 0x380) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 2) {
        pMVar10 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar10);
        if (uVar8 == 0x13) {
          pMVar10 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar10);
          if (_Var7) {
            pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar10 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar10);
            _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
            if (_Var7) {
              pcVar14 = "jalr.hb $\x02";
              goto LAB_00203a2c;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x469) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 2) {
        pMVar10 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar10);
        if (uVar8 == 0x15) {
          pMVar10 = MCInst_getOperand(MI,1);
          uVar8 = MCOperand_getReg(pMVar10);
          if (uVar8 == 0x15) {
LAB_00202f33:
            pcVar14 = "nop";
            goto LAB_00203a2c;
          }
        }
      }
    }
    else if ((uVar8 == 0x598) || (uVar8 == 0x59b)) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 1) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar10);
        if (_Var7) {
          pMVar10 = MCInst_getOperand(MI,0);
          iVar12 = MCOperand_getImm(pMVar10);
          if (iVar12 == 0) {
            pcVar14 = "sdbbp";
            goto LAB_00203a2c;
          }
        }
      }
    }
    else if ((uVar8 == 0x5e1) || (uVar8 == 0x5ee)) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar10 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar10);
        if (uVar8 == 0x15) {
          pMVar10 = MCInst_getOperand(MI,1);
          uVar8 = MCOperand_getReg(pMVar10);
          if (uVar8 == 0x15) {
            pMVar10 = MCInst_getOperand(MI,2);
            _Var7 = MCOperand_isImm(pMVar10);
            if (_Var7) {
              pMVar10 = MCInst_getOperand(MI,2);
              iVar12 = MCOperand_getImm(pMVar10);
              if (iVar12 == 0) goto LAB_00202f33;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x63e) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar10);
        if (_Var7) {
          pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar10 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar10);
          _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
          if (_Var7) {
            pMVar10 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar10);
            if (uVar8 == 0x15) {
              pMVar10 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isReg(pMVar10);
              if (_Var7) {
                pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                pMVar10 = MCInst_getOperand(MI,2);
                uVar8 = MCOperand_getReg(pMVar10);
                _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
                if (_Var7) {
                  pcVar14 = "neg $\x01, $\x03";
                  goto LAB_00203a2c;
                }
              }
            }
          }
        }
      }
    }
    else if (uVar8 == 0x666) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar10);
        if (_Var7) {
          pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar10 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar10);
          _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
          if (_Var7) {
            pMVar10 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar10);
            if (uVar8 == 0x15) {
              pMVar10 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isReg(pMVar10);
              if (_Var7) {
                pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                pMVar10 = MCInst_getOperand(MI,2);
                uVar8 = MCOperand_getReg(pMVar10);
                _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
                if (_Var7) {
                  pcVar14 = "negu $\x01, $\x03";
                  goto LAB_00203a2c;
                }
              }
            }
          }
        }
      }
    }
    else if (uVar8 == 0x681) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 1) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar10);
        if (_Var7) {
          pMVar10 = MCInst_getOperand(MI,0);
          iVar12 = MCOperand_getImm(pMVar10);
          if (iVar12 == 0) {
            pcVar14 = "sync";
            goto LAB_00203a2c;
          }
        }
      }
    }
    else if (uVar8 == 0x684) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 1) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar10);
        if (_Var7) {
          pMVar10 = MCInst_getOperand(MI,0);
          iVar12 = MCOperand_getImm(pMVar10);
          if (iVar12 == 0) {
            pcVar14 = "syscall";
            goto LAB_00203a2c;
          }
        }
      }
    }
    else if (uVar8 == 0x6b6) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar10);
        if (_Var7) {
          pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar10 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar10);
          _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
          if (_Var7) {
            pMVar10 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar10);
            if (_Var7) {
              pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar10 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar10);
              _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
              if (_Var7) {
                pMVar10 = MCInst_getOperand(MI,2);
                _Var7 = MCOperand_isImm(pMVar10);
                if (_Var7) {
                  pMVar10 = MCInst_getOperand(MI,2);
                  iVar12 = MCOperand_getImm(pMVar10);
                  if (iVar12 == 0) {
                    pcVar14 = "teq $\x01, $\x02";
                    goto LAB_00203a2c;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar8 == 0x6ba) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar10);
        if (_Var7) {
          pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar10 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar10);
          _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
          if (_Var7) {
            pMVar10 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar10);
            if (_Var7) {
              pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar10 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar10);
              _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
              if (_Var7) {
                pMVar10 = MCInst_getOperand(MI,2);
                _Var7 = MCOperand_isImm(pMVar10);
                if (_Var7) {
                  pMVar10 = MCInst_getOperand(MI,2);
                  iVar12 = MCOperand_getImm(pMVar10);
                  if (iVar12 == 0) {
                    pcVar14 = "tge $\x01, $\x02";
                    goto LAB_00203a2c;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar8 == 0x6bf) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar10);
        if (_Var7) {
          pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar10 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar10);
          _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
          if (_Var7) {
            pMVar10 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar10);
            if (_Var7) {
              pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar10 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar10);
              _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
              if (_Var7) {
                pMVar10 = MCInst_getOperand(MI,2);
                _Var7 = MCOperand_isImm(pMVar10);
                if (_Var7) {
                  pMVar10 = MCInst_getOperand(MI,2);
                  iVar12 = MCOperand_getImm(pMVar10);
                  if (iVar12 == 0) {
                    pcVar14 = "tgeu $\x01, $\x02";
                    goto LAB_00203a2c;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar8 == 0x6ca) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar10);
        if (_Var7) {
          pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar10 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar10);
          _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
          if (_Var7) {
            pMVar10 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar10);
            if (_Var7) {
              pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar10 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar10);
              _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
              if (_Var7) {
                pMVar10 = MCInst_getOperand(MI,2);
                _Var7 = MCOperand_isImm(pMVar10);
                if (_Var7) {
                  pMVar10 = MCInst_getOperand(MI,2);
                  iVar12 = MCOperand_getImm(pMVar10);
                  if (iVar12 == 0) {
                    pcVar14 = "tlt $\x01, $\x02";
                    goto LAB_00203a2c;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar8 == 0x6ce) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar10);
        if (_Var7) {
          pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar10 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar10);
          _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
          if (_Var7) {
            pMVar10 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar10);
            if (_Var7) {
              pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar10 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar10);
              _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
              if (_Var7) {
                pMVar10 = MCInst_getOperand(MI,2);
                _Var7 = MCOperand_isImm(pMVar10);
                if (_Var7) {
                  pMVar10 = MCInst_getOperand(MI,2);
                  iVar12 = MCOperand_getImm(pMVar10);
                  if (iVar12 == 0) {
                    pcVar14 = "tltu $\x01, $\x02";
                    goto LAB_00203a2c;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar8 == 0x6d1) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar10);
        if (_Var7) {
          pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar10 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar10);
          _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
          if (_Var7) {
            pMVar10 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar10);
            if (_Var7) {
              pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar10 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar10);
              _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
              if (_Var7) {
                pMVar10 = MCInst_getOperand(MI,2);
                _Var7 = MCOperand_isImm(pMVar10);
                if (_Var7) {
                  pMVar10 = MCInst_getOperand(MI,2);
                  iVar12 = MCOperand_getImm(pMVar10);
                  if (iVar12 == 0) {
                    pcVar14 = "tne $\x01, $\x02";
                    goto LAB_00203a2c;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if ((uVar8 == 0x4d) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 3)) {
      pMVar10 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isReg(pMVar10);
      if (_Var7) {
        pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pMVar10 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar10);
        _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
        if (_Var7) {
          pMVar10 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar10);
          if (_Var7) {
            pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar10 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar10);
            _Var7 = MCRegisterClass_contains(pMVar11,uVar8);
            if (_Var7) {
              pMVar10 = MCInst_getOperand(MI,2);
              uVar8 = MCOperand_getReg(pMVar10);
              if (uVar8 == 0x15) goto LAB_00203964;
            }
          }
        }
      }
    }
  }
  uVar8 = MCInst_getOpcode(MI);
  if (uVar8 == 0xb5) {
    _Var7 = isReg(MI,0,0x9b);
    if (!_Var7) goto LAB_00203d0d;
    pcVar14 = "bc1f";
LAB_00203ca0:
    uVar8 = 1;
LAB_00203ca2:
    s = printAlias1(pcVar14,MI,uVar8,O);
LAB_00203cd9:
    if (s != (char *)0x0) {
LAB_00203ce1:
      Op = Mips_map_insn(s);
      MCInst_setOpcodePub(MI,Op);
      (*cs_mem_free)(s);
      return;
    }
  }
  else if (uVar8 == 0xb9) {
    _Var7 = isReg(MI,0,0x9b);
    if (_Var7) {
      pcVar14 = "bc1t";
      goto LAB_00203ca0;
    }
  }
  else {
    if (uVar8 == 0xce) {
LAB_00203b5a:
      _Var7 = isReg(MI,0,0x15);
      if ((_Var7) && (_Var7 = isReg(MI,1,0x15), _Var7)) {
        pcVar14 = "b";
        uVar8 = 2;
        goto LAB_00203ca2;
      }
      uVar8 = 0x15;
LAB_00203cbb:
      _Var7 = isReg(MI,1,uVar8);
      if (!_Var7) goto LAB_00203d0d;
      pcVar14 = "beqz";
LAB_00203ccb:
      uVar8 = 2;
LAB_00203ccd:
      s = printAlias2(pcVar14,MI,uVar8,(uint)O,in_R8);
      goto LAB_00203cd9;
    }
    if (uVar8 == 0xcf) {
      uVar8 = 0x14b;
      goto LAB_00203cbb;
    }
    if (uVar8 == 0x505) {
      _Var7 = isReg(MI,2,0x15);
      if (!_Var7) goto LAB_00203d0d;
      pcVar14 = "move";
LAB_00203c58:
      uVar8 = 1;
      goto LAB_00203ccd;
    }
    if (uVar8 == 0xdb) {
      _Var7 = isReg(MI,0,0x15);
      if (_Var7) {
        pcVar14 = "bal";
        goto LAB_00203ca0;
      }
      goto LAB_00203d0d;
    }
    if (uVar8 == 0x111) {
      uVar8 = 0x15;
    }
    else {
      if (uVar8 != 0x112) {
        if (uVar8 == 0x379) {
          uVar8 = 0x13;
        }
        else {
          if (uVar8 != 0x37b) {
            if (uVar8 == 0x4fa) {
LAB_00203b8b:
              uVar8 = 0x15;
            }
            else {
              if (uVar8 != 0x4fb) {
                if (uVar8 != 0x4fd) {
                  if (uVar8 == 0xd6) goto LAB_00203b5a;
                  goto LAB_00203d0d;
                }
                goto LAB_00203b8b;
              }
              uVar8 = 0x14b;
            }
            _Var7 = isReg(MI,2,uVar8);
            if (!_Var7) goto LAB_00203d0d;
            pcVar14 = "not";
            goto LAB_00203c58;
          }
          uVar8 = 0x115;
        }
        _Var7 = isReg(MI,0,uVar8);
        if (_Var7) {
          pcVar14 = "jalr";
          goto LAB_00203ca0;
        }
        goto LAB_00203d0d;
      }
      uVar8 = 0x14b;
    }
    _Var7 = isReg(MI,1,uVar8);
    if (_Var7) {
      pcVar14 = "bnez";
      goto LAB_00203ccb;
    }
  }
LAB_00203d0d:
  uVar8 = MCInst_getOpcode(MI);
  uVar8 = *(uint *)(printInstruction_OpInfo + (ulong)uVar8 * 4);
  uVar9 = MCInst_getOpcode(MI);
  bVar5 = printInstruction_OpInfo2[uVar9];
  SStream_concat0(O,&UNK_0039fadf + (uVar8 & 0x3fff));
  switch(uVar8 >> 0xe & 0xf) {
  case 1:
    uVar9 = 0;
    break;
  case 2:
    uVar9 = 1;
    goto LAB_00203ea6;
  case 3:
    uVar9 = 2;
LAB_00203ea6:
    printOperand(MI,uVar9,O);
    pcVar14 = ", ";
LAB_00203f41:
    SStream_concat0(O,pcVar14);
    goto LAB_00203f49;
  case 4:
    printUnsignedImm8(MI,0,O);
    return;
  case 5:
    printUnsignedImm(MI,2,O);
    SStream_concat0(O,", ");
  case 9:
    uStack_50 = 0;
    goto LAB_002040d1;
  case 6:
    pMVar10 = MCInst_getOperand(MI,2);
    uVar13 = MCOperand_getImm(pMVar10);
    if ((uVar13 & 0xffffffe0) == 0) {
      pcVar14 = &DAT_003a1ff4 + *(int *)(&DAT_003a1ff4 + (ulong)((uint)uVar13 & 0x1f) * 4);
    }
    else {
      pcVar14 = (char *)0x0;
    }
    goto LAB_00203f41;
  case 7:
    uVar9 = MCInst_getNumOperands(MI);
    for (i = 0; uVar9 - 2 != i; i = i + 1) {
      if (i != 0) {
        SStream_concat0(O,", ");
      }
      pMVar10 = MCInst_getOperand(MI,i);
      RegNo = MCOperand_getReg(pMVar10);
      printRegName(O,RegNo);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar6 = MI->flat_insn->detail;
        puVar3 = pcVar6->groups + (ulong)(pcVar6->field_6).x86.prefix[0] * 0x18 + 0x15;
        puVar3[0] = '\x01';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar6 = MI->flat_insn->detail;
        *(uint *)(pcVar6->groups + (ulong)(pcVar6->field_6).x86.prefix[0] * 0x18 + 0x1d) = RegNo;
        paVar2 = &MI->flat_insn->detail->field_6;
        (paVar2->x86).prefix[0] = (paVar2->x86).prefix[0] + '\x01';
      }
    }
    SStream_concat0(O,", ");
    goto LAB_00203f49;
  case 8:
    pMVar10 = MCInst_getOperand(MI,0);
    uVar8 = MCOperand_getReg(pMVar10);
    printRegName(O,uVar8);
    SStream_concat0(O,", ");
    goto switchD_00203f6d_caseD_f;
  case 10:
    uVar9 = 3;
    break;
  default:
    goto switchD_00203d79_default;
  }
  printOperand(MI,uVar9,O);
LAB_00203f49:
  switch(uVar8 >> 0x12 & 0x1f) {
  case 1:
    printOperand(MI,2,O);
    goto LAB_00204077;
  case 2:
    goto switchD_00203d79_default;
  case 3:
    goto switchD_00203f6d_caseD_3;
  case 4:
    pcVar14 = ", $pc, ";
    goto LAB_00204044;
  case 5:
    pcVar14 = " # 16 bit inst";
    break;
  case 6:
    goto switchD_00203f6d_caseD_6;
  case 7:
    goto switchD_00203f6d_caseD_7;
  case 8:
    pcVar14 = ".d\t";
    goto LAB_00204028;
  case 9:
    pcVar14 = ".s\t";
LAB_00204028:
    SStream_concat0(O,pcVar14);
    printOperand(MI,0,O);
    pcVar14 = ", ";
LAB_00204044:
    SStream_concat0(O,pcVar14);
switchD_00203f6d_caseD_3:
    uStack_50 = 1;
LAB_00204052:
    printOperand(MI,uStack_50,O);
    return;
  case 10:
    pcVar14 = ", [";
    goto LAB_0020406f;
  case 0xb:
    pcVar14 = "\n\tnop";
    break;
  case 0xc:
    pcVar14 = "\t# branch\n\tnop";
    break;
  case 0xd:
    goto switchD_00203f6d_caseD_d;
  case 0xe:
    SStream_concat0(O,", 1f\n\tb\t2f\n\t.align\t2\n1: \t.word\t");
    printOperand(MI,1,O);
    pcVar14 = "\n2:";
    break;
  case 0xf:
switchD_00203f6d_caseD_f:
    uStack_50 = 2;
    goto LAB_002040d1;
  case 0x10:
    pcVar14 = ", .+4\n\t\n\tmove ";
    goto LAB_00203fb1;
  default:
    pcVar14 = "  , ";
LAB_0020406f:
    SStream_concat0(O,pcVar14 + 2);
LAB_00204077:
    switch(uVar8 >> 0x17 & 0xf) {
    case 1:
      goto switchD_00203d79_default;
    case 2:
      goto switchD_0020409b_caseD_2;
    case 3:
      goto switchD_0020409b_caseD_3;
    case 4:
      printUnsignedImm(MI,1,O);
      pcVar14 = ", ";
      switch(uVar8 >> 0x1b & 0xf) {
      default:
        goto switchD_00203d79_default;
      case 1:
        goto switchD_0020422e_caseD_1;
      case 2:
        goto switchD_0020422e_caseD_2;
      case 3:
        goto switchD_00203f6d_caseD_6;
      case 4:
        goto switchD_0020422e_caseD_4;
      case 5:
        goto switchD_0020422e_caseD_5;
      case 6:
        goto switchD_0020422e_caseD_6;
      case 7:
        goto switchD_0020422e_caseD_7;
      case 8:
        goto switchD_0020422e_caseD_8;
      case 9:
        goto switchD_0020422e_caseD_9;
      case 10:
        goto switchD_0020422e_caseD_a;
      case 0xb:
        goto switchD_0020422e_caseD_b;
      case 0xc:
        goto switchD_0020422e_caseD_c;
      case 0xd:
        goto switchD_0020422e_caseD_d;
      case 0xe:
        goto switchD_0020422e_caseD_e;
      }
    case 5:
      printUnsignedImm(MI,3,O);
      pcVar14 = "], ";
      goto LAB_00203fce;
    case 6:
      printUnsignedImm(MI,2,O);
      SStream_concat0(O,"], ");
      printOperand(MI,3,O);
      SStream_concat0(O,"[");
      printUnsignedImm(MI,4,O);
      goto switchD_00204433_caseD_2;
    case 7:
switchD_00203f6d_caseD_d:
      uStack_50 = 1;
LAB_002040d1:
      printMemOperand(MI,uStack_50,O);
      return;
    case 8:
      SStream_concat0(O,", ");
      goto LAB_0020416c;
    case 9:
      SStream_concat0(O,"\n\tmflo\t");
switchD_00203f6d_caseD_7:
      uStack_50 = 0;
      goto LAB_00204052;
    case 10:
      printOperand(MI,4,O);
      pcVar14 = ", ";
      switch(uVar8 >> 0x1b & 0xf) {
      default:
        goto switchD_00203d79_default;
      case 1:
        goto switchD_0020422e_caseD_1;
      case 2:
        goto switchD_0020422e_caseD_2;
      case 3:
        goto switchD_00203f6d_caseD_6;
      case 4:
        goto switchD_0020422e_caseD_4;
      case 5:
        goto switchD_0020422e_caseD_5;
      case 6:
        goto switchD_0020422e_caseD_6;
      case 7:
        goto switchD_0020422e_caseD_7;
      case 8:
        goto switchD_0020422e_caseD_8;
      case 9:
        goto switchD_0020422e_caseD_9;
      case 10:
        goto switchD_0020422e_caseD_a;
      case 0xb:
        goto switchD_0020422e_caseD_b;
      case 0xc:
        goto switchD_0020422e_caseD_c;
      case 0xd:
        goto switchD_0020422e_caseD_d;
      case 0xe:
        goto switchD_0020422e_caseD_e;
      }
    case 0xb:
      SStream_concat0(O,"\n\tmove\t");
      printOperand(MI,0,O);
      pcVar14 = ", $t8";
      break;
    default:
      printOperand(MI,1,O);
      pcVar14 = ", ";
      switch(uVar8 >> 0x1b & 0xf) {
      default:
        goto switchD_00203d79_default;
      case 1:
        goto switchD_0020422e_caseD_1;
      case 2:
        goto switchD_0020422e_caseD_2;
      case 3:
        goto switchD_00203f6d_caseD_6;
      case 4:
        goto switchD_0020422e_caseD_4;
      case 5:
        goto switchD_0020422e_caseD_5;
      case 6:
        goto switchD_0020422e_caseD_6;
      case 7:
        goto switchD_0020422e_caseD_7;
      case 8:
        goto switchD_0020422e_caseD_8;
      case 9:
        goto switchD_0020422e_caseD_9;
      case 10:
        goto switchD_0020422e_caseD_a;
      case 0xb:
        goto switchD_0020422e_caseD_b;
      case 0xc:
        goto switchD_0020422e_caseD_c;
      case 0xd:
        goto switchD_0020422e_caseD_d;
      case 0xe:
        goto switchD_0020422e_caseD_e;
      }
    }
  }
LAB_00204240:
  SStream_concat0(O,pcVar14);
  return;
switchD_0020409b_caseD_2:
  printOperand(MI,2,O);
  pcVar14 = ", ";
  switch(uVar8 >> 0x1b & 0xf) {
  default:
    goto switchD_00203d79_default;
  case 1:
    goto switchD_0020422e_caseD_1;
  case 2:
switchD_0020422e_caseD_2:
    pcVar14 = "\t# 16 bit inst";
    goto LAB_00204240;
  case 3:
switchD_00203f6d_caseD_6:
    pcVar14 = "  # 16 bit inst";
    goto LAB_00204240;
  case 4:
switchD_0020422e_caseD_4:
    pcVar14 = "\n\tbteqz\t";
    break;
  case 5:
switchD_0020422e_caseD_5:
    pcVar14 = "\n\tbtnez\t";
    break;
  case 6:
switchD_0020422e_caseD_6:
    pcVar14 = "[";
    goto switchD_0020422e_caseD_1;
  case 7:
switchD_0020422e_caseD_7:
    pcVar14 = " \t# 16 bit inst";
    goto LAB_00204240;
  case 8:
switchD_0020422e_caseD_8:
    pcVar14 = ", 32";
    goto LAB_00204240;
  case 9:
switchD_0020422e_caseD_9:
    SStream_concat0(O,"\n\taddiu\t");
    printOperand(MI,1,O);
    SStream_concat0(O,", $pc, ");
    printOperand(MI,3,O);
    pcVar14 = "\n ";
    goto LAB_00204240;
  case 10:
switchD_0020422e_caseD_a:
    SStream_concat0(O,"(");
    printOperand(MI,1,O);
    pcVar14 = ")";
    goto LAB_00204240;
  case 0xb:
switchD_0020422e_caseD_b:
    SStream_concat0(O," ( ");
    printOperand(MI,1,O);
    pcVar14 = " ); ";
    goto LAB_00204240;
  case 0xc:
switchD_0020422e_caseD_c:
    pcVar14 = ", 0";
    goto LAB_00204240;
  case 0xd:
switchD_0020422e_caseD_d:
    pcVar14 = "\n\tbteqz\t.+4\n\tmove ";
    goto LAB_00203fb1;
  case 0xe:
switchD_0020422e_caseD_e:
    pcVar14 = "\n\tbtnez\t.+4\n\tmove ";
LAB_00203fb1:
    SStream_concat0(O,pcVar14);
switchD_0020409b_caseD_3:
    printOperand(MI,1,O);
    pcVar14 = ", ";
  }
LAB_00203fce:
  SStream_concat0(O,pcVar14);
  uStack_50 = 2;
  goto LAB_00204052;
switchD_0020422e_caseD_1:
  SStream_concat0(O,pcVar14);
  switch((uint)(CONCAT14(bVar5,uVar8) >> 0x1f) & 7) {
  case 1:
    break;
  case 2:
    printUnsignedImm(MI,2,O);
    switch(bVar5 >> 2 & 3) {
    default:
      goto switchD_00203d79_default;
    case 1:
      goto switchD_00204433_caseD_1;
    case 2:
      goto switchD_00204433_caseD_2;
    }
  case 3:
    printUnsignedImm8(MI,3,O);
    switch(bVar5 >> 2 & 3) {
    default:
      goto switchD_00203d79_default;
    case 1:
      goto switchD_00204433_caseD_1;
    case 2:
      goto switchD_00204433_caseD_2;
    }
  case 4:
    printOperand(MI,3,O);
    switch(bVar5 >> 2 & 3) {
    default:
      goto switchD_00203d79_default;
    case 1:
      goto switchD_00204433_caseD_1;
    case 2:
      goto switchD_00204433_caseD_2;
    }
  default:
    printOperand(MI,2,O);
    switch(bVar5 >> 2 & 3) {
    default:
      goto switchD_00203d79_default;
    case 1:
      goto switchD_00204433_caseD_1;
    case 2:
      goto switchD_00204433_caseD_2;
    }
  }
  printUnsignedImm8(MI,2,O);
  switch(bVar5 >> 2 & 3) {
  default:
switchD_00203d79_default:
    return;
  case 1:
switchD_00204433_caseD_1:
    SStream_concat0(O,", ");
    if ((bVar5 & 0x10) == 0) {
      printUnsignedImm(MI,3,O);
      return;
    }
LAB_0020416c:
    uStack_50 = 3;
    break;
  case 2:
switchD_00204433_caseD_2:
    pcVar14 = "]";
    goto LAB_00204240;
  }
  goto LAB_00204052;
}

Assistant:

void Mips_printInst(MCInst *MI, SStream *O, void *info)
{
	char *mnem;

	switch (MCInst_getOpcode(MI)) {
		default: break;
		case Mips_Save16:
		case Mips_SaveX16:
		case Mips_Restore16:
		case Mips_RestoreX16:
			return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, info);
	if (!mnem) {
		mnem = printAlias(MI, O);
		if (!mnem) {
			printInstruction(MI, O, NULL);
		}
	}

	if (mnem) {
		// fixup instruction id due to the change in alias instruction
		MCInst_setOpcodePub(MI, Mips_map_insn(mnem));
		cs_mem_free(mnem);
	}
}